

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  initializer_list<int> __l;
  allocator_type local_b1;
  LockProxy guard;
  _Vector_base<int,_std::allocator<int>_> local_a0;
  CategoriesMutex mutex;
  
  guard.status = THREADS_COUNT_EXCEEDED;
  guard._4_4_ = 3;
  guard.mutex_._0_4_ = 5;
  __l._M_len = 3;
  __l._M_array = (iterator)&guard;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_a0,__l,&local_b1);
  CategoriesMutex::CategoriesMutex(&mutex,(vector<int,_std::allocator<int>_> *)&local_a0);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_a0);
  CategoriesMutex::try_lock((CategoriesMutex *)&guard,(int)&mutex);
  CategoriesMutex::LockProxy::~LockProxy(&guard);
  CategoriesMutex::~CategoriesMutex(&mutex);
  return 0;
}

Assistant:

int main() {
    CategoriesMutex mutex({1, 3, 5});
    if (auto guard = mutex.try_lock(1); guard) {
        // critical section
    }
}